

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O3

void deblock_edge_chro_hor
               (pel *src,int stride,int alpha_u,int beta_u,int alpha_v,int beta_v,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int local_ac;
  int *local_a8;
  int local_34;
  
  local_a8 = &local_34;
  uVar11 = (ulong)(edge_flag * 2 & 4) ^ 4;
  lVar15 = 0;
  bVar9 = true;
  do {
    bVar10 = bVar9;
    lVar6 = lVar15 + (uVar11 - (long)(stride * 2));
    lVar7 = lVar15 + (uVar11 - (long)stride);
    lVar8 = lVar15 + uVar11 + (long)stride;
    lVar18 = 0;
    do {
      uVar20 = (uint)src[lVar18 * 2 + lVar6];
      bVar1 = src[lVar18 * 2 + lVar7];
      uVar16 = (uint)src[lVar18 * 2 + lVar15 + uVar11];
      bVar2 = src[lVar18 * 2 + lVar8];
      uVar12 = uVar16 - bVar1;
      uVar5 = -uVar12;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      uVar13 = uVar20 - bVar1;
      uVar12 = -uVar13;
      if (0 < (int)uVar13) {
        uVar12 = uVar13;
      }
      uVar14 = (uint)src[lVar18 * 2 + lVar15 + uVar11] - (uint)bVar2;
      uVar13 = -uVar14;
      if (0 < (int)uVar14) {
        uVar13 = uVar14;
      }
      if (((int)(uVar12 & 0xff) < beta_u) && ((int)(uVar13 & 0xff) < beta_u)) {
        bVar3 = src[lVar18 * 2 + lVar15 + uVar11 + (long)(stride * -3)];
        bVar4 = src[lVar18 * 2 + lVar15 + uVar11 + (long)(stride * 2)];
        src[lVar18 * 2 + lVar7] =
             (pel)(uVar20 * 3 + uVar16 * 3 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 + 8 >> 4);
        iVar17 = (uint)bVar1 + (uint)bVar1 * 2;
        src[lVar18 * 2 + lVar15 + uVar11] =
             (pel)((uint)bVar2 + (uint)bVar2 * 2 + iVar17 + uVar16 * 10 + 8 >> 4);
        uVar19 = (uint)bVar3 - (uint)bVar1;
        uVar14 = -uVar19;
        if (0 < (int)uVar19) {
          uVar14 = uVar19;
        }
        if (uVar14 < (uint)beta_u) {
          uVar19 = bVar4 - uVar16;
          uVar14 = -uVar19;
          if (0 < (int)uVar19) {
            uVar14 = uVar19;
          }
          if ((((uVar14 < (uint)beta_u) && ((uVar13 & 0xff) <= (uint)beta_u >> 2)) &&
              ((uVar12 & 0xff) <= (uint)beta_u >> 2)) && ((int)(uVar5 & 0xff) < *local_a8)) {
            src[lVar18 * 2 + lVar6] =
                 (pel)((uint)bVar3 * 3 + uVar20 * 8 + iVar17 + uVar16 * 2 + 8 >> 4);
            src[lVar18 * 2 + lVar8] =
                 (pel)((uint)bVar4 * 3 + uVar16 * 3 + (uint)bVar1 * 2 + (uint)bVar2 * 8 + 8 >> 4);
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while ((uint)((~edge_flag & 0x202U) == 0) * 2 + 2 != (int)lVar18);
    lVar15 = 1;
    local_a8 = &local_ac;
    beta_u = beta_v;
    bVar9 = false;
  } while (bVar10);
  return;
}

Assistant:

void deblock_edge_chro_hor(pel *src, int stride, int alpha_u, int beta_u, int alpha_v, int beta_v, int edge_flag)
{
    int i, line_size = 4;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int alpha[2] = { alpha_u, alpha_v };
    int beta[2] = { beta_u, beta_v };
    pel *p_src;
    int uv;

    if ((edge_flag & 0x0202) != 0x0202) {
        line_size = 2;
    }
    if (!(edge_flag & 0x2)) {
        src += 4;
    }

    for (uv = 0; uv < 2; uv++) {
        p_src = src + uv;
        for (i = 0; i < line_size; i++, p_src += 2) {
            int L2 = p_src[-inc3];
            int L1 = p_src[-inc2];
            int L0 = p_src[-inc];
            int R0 = p_src[0];
            int R1 = p_src[inc];
            int R2 = p_src[inc2];
            int delta_m = COM_ABS(R0 - L0);
            int delta_l = COM_ABS(L1 - L0);
            int delta_r = COM_ABS(R0 - R1);

            if ((delta_l < beta[uv]) && (delta_r < beta[uv])) {
                p_src[-inc] = (pel)((L1 * 3 + L0 * 10 + R0 * 3 + 8) >> 4);                  // L0
                p_src[0] = (pel)((R1 * 3 + R0 * 10 + L0 * 3 + 8) >> 4);                     // R0
                if ((COM_ABS(L2 - L0) < beta[uv]) && (COM_ABS(R2 - R0) < beta[uv]) && 
                    delta_r <= beta[uv] / 4 && delta_l <= beta[uv] / 4 && delta_m < alpha[uv]) {
                    p_src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 3 + R0 * 2 + 8) >> 4);     // L1
                    p_src[inc] = (pel)((R2 * 3 + R1 * 8 + R0 * 3 + L0 * 2 + 8) >> 4);       // R1
                }
            }
        }
    }
}